

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdNode * Cudd_VectorSupport(DdManager *dd,DdNode **F,int n)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  DdNode *g;
  DdNode *pDVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int index;
  DdNode *f;
  
  uVar6 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar6 = dd->sizeZ;
  }
  piVar2 = (int *)malloc((long)(int)uVar6 << 2);
  if (piVar2 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_006711df:
    f = (DdNode *)0x0;
  }
  else {
    uVar3 = 0;
    uVar5 = 0;
    if (0 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      piVar2[uVar3] = 0;
    }
    uVar5 = 0;
    uVar3 = (ulong)(uint)n;
    if (n < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      ddSupportStep((DdNode *)((ulong)F[uVar5] & 0xfffffffffffffffe),piVar2);
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      ddClearFlag((DdNode *)((ulong)F[uVar5] & 0xfffffffffffffffe));
    }
    f = dd->one;
    piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    while (0 < (int)uVar6) {
      uVar7 = uVar6 - 1;
      if (dd->size < (int)uVar6) {
        index = uVar6 - 1;
      }
      else {
        index = dd->invperm[uVar7];
      }
      uVar6 = uVar7;
      if (piVar2[index] == 1) {
        g = cuddUniqueInter(dd,index,dd->one,(DdNode *)((ulong)dd->one ^ 1));
        piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = Cudd_bddAnd(dd,f,g);
        if (pDVar4 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,f);
          Cudd_RecursiveDeref(dd,g);
          free(piVar2);
          goto LAB_006711df;
        }
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,f);
        Cudd_RecursiveDeref(dd,g);
        f = pDVar4;
      }
    }
    free(piVar2);
    piVar2 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
    *piVar2 = *piVar2 + -1;
  }
  return f;
}

Assistant:

DdNode *
Cudd_VectorSupport(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    DdNode *res, *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    /* Transform support from array to cube. */
    res = DD_ONE(dd);
    cuddRef(res);
    for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
        i = (j >= dd->size) ? j : dd->invperm[j];
        if (support[i] == 1) {
            var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
            cuddRef(var);
            tmp = Cudd_bddAnd(dd,res,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,res);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(support);
                return(NULL);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,res);
            Cudd_RecursiveDeref(dd,var);
            res = tmp;
        }
    }

    ABC_FREE(support);
    cuddDeref(res);
    return(res);

}